

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O3

int main(void)

{
  int iVar1;
  GLFWwindow *handle;
  long lVar2;
  GLFWwindow **arg;
  undefined8 *puVar3;
  GLFWwindow **ppGVar4;
  int result;
  Thread threads [3];
  undefined8 uStack_a0;
  GLFWwindow *local_98 [4];
  thrd_t local_78 [11];
  
  arg = local_98;
  puVar3 = &DAT_0012dc60;
  ppGVar4 = arg;
  for (lVar2 = 0xf; lVar2 != 0; lVar2 = lVar2 + -1) {
    *ppGVar4 = (GLFWwindow *)*puVar3;
    puVar3 = puVar3 + 1;
    ppGVar4 = ppGVar4 + 1;
  }
  glfwSetErrorCallback(error_callback);
  iVar1 = glfwInit();
  if (iVar1 != 0) {
    glfwWindowHint(0x20004,0);
    iVar1 = 200;
    lVar2 = 8;
    do {
      handle = glfwCreateWindow(200,200,*(char **)((long)local_98 + lVar2),(GLFWmonitor *)0x0,
                                (GLFWwindow *)0x0);
      *(GLFWwindow **)((long)&uStack_a0 + lVar2) = handle;
      if (handle == (GLFWwindow *)0x0) goto LAB_00111e5b;
      glfwSetWindowPos(handle,iVar1,200);
      glfwShowWindow(handle);
      iVar1 = iVar1 + 0xfa;
      lVar2 = lVar2 + 0x28;
    } while (lVar2 != 0x80);
    glfwMakeContextCurrent(local_98[0]);
    gladLoadGLLoader(glfwGetProcAddress);
    glfwMakeContextCurrent((GLFWwindow *)0x0);
    lVar2 = 3;
    while (iVar1 = thrd_create((thrd_t *)(arg + 4),thread_main,arg), iVar1 == 1) {
      arg = arg + 5;
      lVar2 = lVar2 + -1;
      if (lVar2 == 0) {
        while (running != 0) {
          glfwWaitEvents();
          lVar2 = 0;
          do {
            iVar1 = glfwWindowShouldClose(*(GLFWwindow **)((long)local_98 + lVar2));
            if (iVar1 != 0) {
              running = 0;
            }
            lVar2 = lVar2 + 0x28;
          } while (lVar2 != 0x78);
        }
        lVar2 = 0;
        do {
          glfwHideWindow(*(GLFWwindow **)((long)local_98 + lVar2));
          lVar2 = lVar2 + 0x28;
        } while (lVar2 != 0x78);
        lVar2 = 0;
        do {
          thrd_join(*(thrd_t *)((long)local_78 + lVar2),(int *)((long)&uStack_a0 + 4));
          lVar2 = lVar2 + 0x28;
        } while (lVar2 != 0x78);
        exit(0);
      }
    }
    fwrite("Failed to create secondary thread\n",0x22,1,_stderr);
LAB_00111e5b:
    glfwTerminate();
  }
  exit(1);
}

Assistant:

int main(void)
{
    int i, result;
    Thread threads[] =
    {
        { NULL, "Red", 1.f, 0.f, 0.f, 0 },
        { NULL, "Green", 0.f, 1.f, 0.f, 0 },
        { NULL, "Blue", 0.f, 0.f, 1.f, 0 }
    };
    const int count = sizeof(threads) / sizeof(Thread);

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    glfwWindowHint(GLFW_VISIBLE, GLFW_FALSE);

    for (i = 0;  i < count;  i++)
    {
        threads[i].window = glfwCreateWindow(200, 200,
                                             threads[i].title,
                                             NULL, NULL);
        if (!threads[i].window)
        {
            glfwTerminate();
            exit(EXIT_FAILURE);
        }

        glfwSetWindowPos(threads[i].window, 200 + 250 * i, 200);
        glfwShowWindow(threads[i].window);
    }

    glfwMakeContextCurrent(threads[0].window);
    gladLoadGLLoader((GLADloadproc) glfwGetProcAddress);
    glfwMakeContextCurrent(NULL);

    for (i = 0;  i < count;  i++)
    {
        if (thrd_create(&threads[i].id, thread_main, threads + i) !=
            thrd_success)
        {
            fprintf(stderr, "Failed to create secondary thread\n");

            glfwTerminate();
            exit(EXIT_FAILURE);
        }
    }

    while (running)
    {
        glfwWaitEvents();

        for (i = 0;  i < count;  i++)
        {
            if (glfwWindowShouldClose(threads[i].window))
                running = GLFW_FALSE;
        }
    }

    for (i = 0;  i < count;  i++)
        glfwHideWindow(threads[i].window);

    for (i = 0;  i < count;  i++)
        thrd_join(threads[i].id, &result);

    exit(EXIT_SUCCESS);
}